

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::emit_store_statement
          (CompilerMSL *this,uint32_t lhs_expression,uint32_t rhs_expression)

{
  bool bVar1;
  uint32_t uVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  SPIRType *pSVar5;
  SPIRType *pSVar6;
  uint32_t id;
  byte local_b4a;
  byte local_b01;
  undefined1 local_b00 [8];
  string rhs_1;
  undefined1 local_ae0 [8];
  string lhs_1;
  undefined1 local_ac0 [64];
  spirv_cross local_a80 [32];
  undefined1 local_a60 [8];
  string rhs;
  undefined1 local_a40 [8];
  string lhs;
  undefined1 local_a20 [72];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d8 [32];
  string *local_9b8;
  size_type column_index_1;
  string lhs_expr_1;
  uint local_98c;
  undefined1 local_988 [4];
  uint32_t c_1;
  SPIRType write_type_1;
  undefined1 local_818 [40];
  undefined1 local_7f0 [4];
  uint32_t i_3;
  spirv_cross local_7d0 [32];
  undefined1 local_7b0 [8];
  string unpacked_expr;
  uint local_78c;
  undefined1 local_788 [4];
  uint32_t j_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768 [8];
  string rhs_row_1;
  uint local_744;
  undefined1 local_740 [4];
  uint32_t i_2;
  SPIRType vector_type_1;
  spirv_cross local_5d0 [32];
  undefined1 local_5b0 [32];
  undefined1 local_590 [68];
  uint local_54c;
  undefined1 local_548 [4];
  uint32_t j;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528 [8];
  string rhs_row;
  uint local_504;
  undefined1 local_500 [4];
  uint32_t i_1;
  SPIRType vector_type;
  undefined1 local_390 [44];
  uint32_t i;
  spirv_cross local_348 [32];
  string local_328 [8];
  string cast_expr;
  undefined1 local_308 [8];
  SPIRType write_type;
  char *pcStack_1b0;
  bool rhs_transpose;
  char *packed_pfx;
  SPIRVariable *local_188;
  SPIRVariable *p_var_lhs;
  string local_178 [8];
  string cast_addr_space;
  SPIRType *physical_type;
  undefined1 local_148 [4];
  TypeID physical_type_id;
  char local_122 [2];
  spirv_cross local_120 [32];
  undefined1 local_100 [8];
  size_type column_index;
  string lhs_expr;
  uint local_d4;
  undefined1 local_d0 [4];
  uint32_t c;
  undefined1 local_b0 [48];
  undefined1 local_80 [32];
  undefined1 local_60 [47];
  bool transpose;
  SPIRExpression *rhs_e;
  SPIRExpression *lhs_e;
  bool lhs_packed_type;
  SPIRFunction *pSStack_20;
  bool lhs_remapped_type;
  SPIRType *type;
  uint32_t rhs_expression_local;
  uint32_t lhs_expression_local;
  CompilerMSL *this_local;
  
  type._0_4_ = rhs_expression;
  type._4_4_ = lhs_expression;
  _rhs_expression_local = (_Hash_node_base *)this;
  pSStack_20 = (SPIRFunction *)Compiler::expression_type((Compiler *)this,rhs_expression);
  lhs_e._7_1_ = Compiler::has_extended_decoration
                          ((Compiler *)this,type._4_4_,SPIRVCrossDecorationPhysicalTypeID);
  lhs_e._6_1_ = Compiler::has_extended_decoration
                          ((Compiler *)this,type._4_4_,SPIRVCrossDecorationPhysicalTypePacked);
  rhs_e = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,type._4_4_);
  register0x00000000 =
       (_Hash_node_base *)
       Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,(uint32_t)type);
  local_b01 = 0;
  if (rhs_e != (SPIRExpression *)0x0) {
    local_b01 = rhs_e->need_transpose;
  }
  local_60[0x27] = local_b01 & 1;
  id = (uint32_t)this;
  if (((lhs_e._7_1_ & 1) == 0) && ((lhs_e._6_1_ & 1) == 0)) {
    bVar1 = Compiler::is_matrix((Compiler *)this,(SPIRType *)pSStack_20);
    if (((bVar1) && (rhs_e != (SPIRExpression *)0x0)) && ((rhs_e->need_transpose & 1U) != 0)) {
      rhs_e->need_transpose = false;
      if (((SPIRExpression *)stack0xffffffffffffffc8 == (SPIRExpression *)0x0) ||
         ((*(bool *)((long)(stack0xffffffffffffffc8 + 7) + 1) & 1U) == 0)) {
        CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_b0,id,SUB41(type._4_4_,0));
        CompilerGLSL::to_unpacked_expression_abi_cxx11_
                  ((CompilerGLSL *)local_d0,id,SUB41((uint32_t)type,0));
        CompilerGLSL::
        statement<std::__cxx11::string,char_const(&)[14],std::__cxx11::string,char_const(&)[3]>
                  (&this->super_CompilerGLSL,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   (char (*) [14])" = transpose(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   (char (*) [3])0x5b3b6e);
        ::std::__cxx11::string::~string((string *)local_d0);
        ::std::__cxx11::string::~string((string *)local_b0);
      }
      else {
        *(bool *)((long)(stack0xffffffffffffffc8 + 7) + 1) = false;
        CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_60,id,SUB41(type._4_4_,0));
        CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                  ((CompilerGLSL *)local_80,id);
        CompilerGLSL::
        statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   (char (*) [4])0x5cb349,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   (char (*) [2])0x5b3b6f);
        ::std::__cxx11::string::~string((string *)local_80);
        ::std::__cxx11::string::~string((string *)local_60);
        *(bool *)((long)(stack0xffffffffffffffc8 + 7) + 1) = true;
      }
      rhs_e->need_transpose = true;
      Compiler::register_write((Compiler *)this,type._4_4_);
    }
    else if ((rhs_e == (SPIRExpression *)0x0) || ((rhs_e->need_transpose & 1U) == 0)) {
      CompilerGLSL::emit_store_statement(&this->super_CompilerGLSL,type._4_4_,(uint32_t)type);
    }
    else {
      rhs_e->need_transpose = false;
      for (local_d4 = AddressingModelLogical; local_d4 < *(AddressingModel *)&pSStack_20->field_0x14
          ; local_d4 = local_d4 + AddressingModelPhysical32) {
        CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                  ((CompilerGLSL *)&column_index,id,SUB41(type._4_4_,0));
        psVar3 = (string *)::std::__cxx11::string::find_last_of((char)&column_index,0x5b);
        local_100 = (undefined1  [8])psVar3;
        if (psVar3 != (string *)0xffffffffffffffff) {
          local_122[1] = '[';
          local_122[0] = ']';
          join<char,unsigned_int&,char>(local_120,local_122 + 1,&local_d4,local_122);
          pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ::std::__cxx11::string::insert((ulong)&column_index,psVar3);
          CompilerGLSL::to_extract_component_expression_abi_cxx11_
                    ((CompilerGLSL *)local_148,id,(uint32_t)type);
          CompilerGLSL::
          statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,pbVar4,(char (*) [4])0x5cb349,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                     (char (*) [2])0x5b3b6f);
          ::std::__cxx11::string::~string((string *)local_148);
          ::std::__cxx11::string::~string((string *)local_120);
        }
        ::std::__cxx11::string::~string((string *)&column_index);
      }
      rhs_e->need_transpose = true;
      Compiler::register_write((Compiler *)this,type._4_4_);
    }
  }
  else if (((lhs_e._7_1_ & 1) != 0) ||
          ((bVar1 = Compiler::is_matrix((Compiler *)this,(SPIRType *)pSStack_20), bVar1 ||
           ((local_60[0x27] & 1) != 0)))) {
    if ((lhs_e._7_1_ & 1) == 0) {
      physical_type._0_4_ = (pSStack_20->super_IVariant).self.id;
    }
    else {
      uVar2 = Compiler::get_extended_decoration
                        ((Compiler *)this,type._4_4_,SPIRVCrossDecorationPhysicalTypeID);
      TypedID<(spirv_cross::Types)0>::TypedID
                ((TypedID<(spirv_cross::Types)0> *)&physical_type,uVar2);
    }
    physical_type._4_4_ = TypedID::operator_cast_to_TypedID((TypedID *)&physical_type);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&physical_type + 4));
    pSVar5 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_178,"thread",(allocator *)((long)&p_var_lhs + 7));
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&p_var_lhs + 7));
    local_188 = Compiler::maybe_get_backing_variable((Compiler *)this,type._4_4_);
    if (local_188 != (SPIRVariable *)0x0) {
      uVar2 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(local_188->super_IVariant).field_0xc);
      pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
      get_type_address_space_abi_cxx11_
                ((CompilerMSL *)&packed_pfx,(SPIRType *)this,(uint32_t)pSVar6,SUB41(type._4_4_,0));
      ::std::__cxx11::string::operator=(local_178,(string *)&packed_pfx);
      ::std::__cxx11::string::~string((string *)&packed_pfx);
    }
    bVar1 = Compiler::is_matrix((Compiler *)this,(SPIRType *)pSStack_20);
    if (bVar1) {
      pcStack_1b0 = "";
      if ((lhs_e._6_1_ & 1) != 0) {
        pcStack_1b0 = "packed_";
      }
      local_b4a = 0;
      if ((SPIRExpression *)stack0xffffffffffffffc8 != (SPIRExpression *)0x0) {
        local_b4a = *(bool *)((long)(stack0xffffffffffffffc8 + 7) + 1);
      }
      write_type.member_name_cache._M_h._M_single_bucket._7_1_ = local_b4a & 1;
      SPIRType::SPIRType((SPIRType *)local_308,(SPIRType *)pSStack_20);
      ::std::__cxx11::string::string(local_328);
      if ((write_type.member_name_cache._M_h._M_single_bucket._7_1_ & 1) != 0) {
        *(bool *)((long)(stack0xffffffffffffffc8 + 7) + 1) = false;
      }
      if ((local_60[0x27] & 1) == 0) {
        write_type.width = 1;
        if (pSVar5->vecsize != *(uint32_t *)&pSStack_20->field_0x14) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&vector_type_1.member_name_cache._M_h._M_single_bucket,this,local_308,0);
          join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string,char_const(&)[3]>
                    (local_5d0,(char (*) [2])0x5cba12,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                     (char (*) [2])0x5b521c,&stack0xfffffffffffffe50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vector_type_1.member_name_cache._M_h._M_single_bucket,(char (*) [3])0x5b4172);
          ::std::__cxx11::string::operator=(local_328,(string *)local_5d0);
          ::std::__cxx11::string::~string((string *)local_5d0);
          ::std::__cxx11::string::~string
                    ((string *)&vector_type_1.member_name_cache._M_h._M_single_bucket);
        }
        if ((write_type.member_name_cache._M_h._M_single_bucket._7_1_ & 1) == 0) {
          for (local_818._36_4_ = 0;
              (uint)local_818._36_4_ <
              *(uint *)&(pSStack_20->arguments).
                        super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
              local_818._36_4_ = local_818._36_4_ + 1) {
            CompilerGLSL::to_enclosed_expression_abi_cxx11_
                      ((CompilerGLSL *)local_818,id,SUB41(type._4_4_,0));
            CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                      ((CompilerGLSL *)&write_type_1.member_name_cache._M_h._M_single_bucket,id,
                       SUB41((uint32_t)type,0));
            CompilerGLSL::
            statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3]>
                      (&this->super_CompilerGLSL,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_328,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_818,(char (*) [2])0x5b2ad8,(uint *)(local_818 + 0x24),
                       (char (*) [2])0x5ab046,(char (*) [4])0x5cb349,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &write_type_1.member_name_cache._M_h._M_single_bucket,(char (*) [2])0x5b2ad8,
                       (uint *)(local_818 + 0x24),(char (*) [3])0x5b704e);
            ::std::__cxx11::string::~string
                      ((string *)&write_type_1.member_name_cache._M_h._M_single_bucket);
            ::std::__cxx11::string::~string((string *)local_818);
          }
        }
        else {
          pSVar5 = Compiler::expression_type((Compiler *)this,(uint32_t)type);
          SPIRType::SPIRType((SPIRType *)local_740,pSVar5);
          vector_type_1.width = 1;
          for (local_744 = 0;
              local_744 <
              *(uint *)&(pSStack_20->arguments).
                        super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
              local_744 = local_744 + 1) {
            CompilerGLSL::type_to_glsl_constructor_abi_cxx11_
                      ((CompilerGLSL *)local_788,(SPIRType *)this);
            ::std::operator+(local_768,local_788);
            ::std::__cxx11::string::~string((string *)local_788);
            for (local_78c = 0; local_78c < (uint)vector_type_1.super_IVariant._12_4_;
                local_78c = local_78c + 1) {
              CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                        ((CompilerGLSL *)local_7b0,id);
              join<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[2]>
                        (local_7d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_7b0,(char (*) [2])0x5b2ad8,&local_78c,(char (*) [3])"][",&local_744,
                         (char (*) [2])0x5ab046);
              ::std::__cxx11::string::operator+=((string *)local_768,(string *)local_7d0);
              ::std::__cxx11::string::~string((string *)local_7d0);
              if (local_78c + 1 < (uint)vector_type_1.super_IVariant._12_4_) {
                ::std::__cxx11::string::operator+=((string *)local_768,", ");
              }
              ::std::__cxx11::string::~string((string *)local_7b0);
            }
            ::std::__cxx11::string::operator+=((string *)local_768,")");
            CompilerGLSL::to_enclosed_expression_abi_cxx11_
                      ((CompilerGLSL *)local_7f0,id,SUB41(type._4_4_,0));
            CompilerGLSL::
            statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                      (&this->super_CompilerGLSL,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_328,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_7f0,(char (*) [2])0x5b2ad8,&local_744,(char (*) [2])0x5ab046,
                       (char (*) [4])0x5cb349,local_768,(char (*) [2])0x5b3b6f);
            ::std::__cxx11::string::~string((string *)local_7f0);
            ::std::__cxx11::string::~string((string *)local_768);
          }
          SPIRType::~SPIRType((SPIRType *)local_740);
        }
      }
      else {
        rhs_e->need_transpose = false;
        write_type.super_IVariant._12_4_ =
             *(undefined4 *)
              &(pSStack_20->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
        write_type.width = 1;
        if (pSVar5->columns !=
            *(uint32_t *)
             &(pSStack_20->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_390 + 0x28,this,local_308,0);
          join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string,char_const(&)[3]>
                    (local_348,(char (*) [2])0x5cba12,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                     (char (*) [2])0x5b521c,&stack0xfffffffffffffe50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_390 + 0x28),(char (*) [3])0x5b4172);
          ::std::__cxx11::string::operator=(local_328,(string *)local_348);
          ::std::__cxx11::string::~string((string *)local_348);
          ::std::__cxx11::string::~string((string *)(local_390 + 0x28));
        }
        if ((write_type.member_name_cache._M_h._M_single_bucket._7_1_ & 1) == 0) {
          pSVar5 = Compiler::expression_type((Compiler *)this,(uint32_t)type);
          SPIRType::SPIRType((SPIRType *)local_500,pSVar5);
          vector_type.super_IVariant._12_4_ = vector_type.width;
          vector_type.width = 1;
          for (local_504 = 0; local_504 < *(uint *)&pSStack_20->field_0x14;
              local_504 = local_504 + 1) {
            CompilerGLSL::type_to_glsl_constructor_abi_cxx11_
                      ((CompilerGLSL *)local_548,(SPIRType *)this);
            ::std::operator+(local_528,local_548);
            ::std::__cxx11::string::~string((string *)local_548);
            for (local_54c = 0; local_54c < (uint)vector_type.super_IVariant._12_4_;
                local_54c = local_54c + 1) {
              CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                        ((CompilerGLSL *)local_590,id,SUB41((uint32_t)type,0));
              join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[2]>
                        ((spirv_cross *)(local_590 + 0x20),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_590,(char (*) [2])0x5b2ad8,&local_54c,(char (*) [3])"][",&local_504,
                         (char (*) [2])0x5ab046);
              ::std::__cxx11::string::operator+=((string *)local_528,(string *)(local_590 + 0x20));
              ::std::__cxx11::string::~string((string *)(local_590 + 0x20));
              ::std::__cxx11::string::~string((string *)local_590);
              if (local_54c + 1 < (uint)vector_type.super_IVariant._12_4_) {
                ::std::__cxx11::string::operator+=((string *)local_528,", ");
              }
            }
            ::std::__cxx11::string::operator+=((string *)local_528,")");
            CompilerGLSL::to_enclosed_expression_abi_cxx11_
                      ((CompilerGLSL *)local_5b0,id,SUB41(type._4_4_,0));
            CompilerGLSL::
            statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                      (&this->super_CompilerGLSL,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_328,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5b0,(char (*) [2])0x5b2ad8,&local_504,(char (*) [2])0x5ab046,
                       (char (*) [4])0x5cb349,local_528,(char (*) [2])0x5b3b6f);
            ::std::__cxx11::string::~string((string *)local_5b0);
            ::std::__cxx11::string::~string((string *)local_528);
          }
          SPIRType::~SPIRType((SPIRType *)local_500);
        }
        else {
          for (local_390._36_4_ = 0; (uint)local_390._36_4_ < *(uint *)&pSStack_20->field_0x14;
              local_390._36_4_ = local_390._36_4_ + 1) {
            CompilerGLSL::to_enclosed_expression_abi_cxx11_
                      ((CompilerGLSL *)local_390,id,SUB41(type._4_4_,0));
            CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                      ((CompilerGLSL *)&vector_type.member_name_cache._M_h._M_single_bucket,id);
            CompilerGLSL::
            statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3]>
                      (&this->super_CompilerGLSL,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_328,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_390,(char (*) [2])0x5b2ad8,(uint *)(local_390 + 0x24),
                       (char (*) [2])0x5ab046,(char (*) [4])0x5cb349,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vector_type.member_name_cache._M_h._M_single_bucket,(char (*) [2])0x5b2ad8,
                       (uint *)(local_390 + 0x24),(char (*) [3])0x5b704e);
            ::std::__cxx11::string::~string
                      ((string *)&vector_type.member_name_cache._M_h._M_single_bucket);
            ::std::__cxx11::string::~string((string *)local_390);
          }
        }
        rhs_e->need_transpose = true;
      }
      if ((write_type.member_name_cache._M_h._M_single_bucket._7_1_ & 1) != 0) {
        *(bool *)((long)(stack0xffffffffffffffc8 + 7) + 1) = true;
      }
      ::std::__cxx11::string::~string(local_328);
      SPIRType::~SPIRType((SPIRType *)local_308);
    }
    else if ((local_60[0x27] & 1) == 0) {
      bVar1 = Compiler::is_matrix((Compiler *)this,pSVar5);
      if (((bVar1) || (bVar1 = Compiler::is_array((Compiler *)this,pSVar5), bVar1)) &&
         (*(uint *)&pSStack_20->field_0x14 < pSVar5->vecsize)) {
        bVar1 = false;
        if (*(uint32_t *)&pSStack_20->field_0x14 != 0) {
          bVar1 = *(uint *)&pSStack_20->field_0x14 < 4;
        }
        if (!bVar1) {
          __assert_fail("type.vecsize >= 1 && type.vecsize <= 3",
                        "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x1357,
                        "virtual void spirv_cross::CompilerMSL::emit_store_statement(uint32_t, uint32_t)"
                       );
        }
        if (((lhs_e._6_1_ ^ 0xff) & 1) == 0) {
          __assert_fail("!lhs_packed_type",
                        "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x135d,
                        "virtual void spirv_cross::CompilerMSL::emit_store_statement(uint32_t, uint32_t)"
                       );
        }
        CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                  ((CompilerGLSL *)local_a40,id,SUB41(type._4_4_,0));
        CompilerGLSL::to_pointer_expression_abi_cxx11_
                  ((CompilerGLSL *)local_a60,id,SUB41((uint32_t)type,0));
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_ac0 + 0x20,this,pSStack_20,0);
        CompilerGLSL::enclose_expression((CompilerGLSL *)local_ac0,(string *)this);
        join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string>
                  (local_a80,(char (*) [2])0x5cba12,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                   (char (*) [2])0x5b521c,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_ac0 + 0x20),(char (*) [3])0x5b4172,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ac0);
        ::std::__cxx11::string::operator=((string *)local_a40,(string *)local_a80);
        ::std::__cxx11::string::~string((string *)local_a80);
        ::std::__cxx11::string::~string((string *)local_ac0);
        ::std::__cxx11::string::~string((string *)(local_ac0 + 0x20));
        pSVar5 = Compiler::expression_type((Compiler *)this,(uint32_t)type);
        bVar1 = CompilerGLSL::optimize_read_modify_write
                          (&this->super_CompilerGLSL,pSVar5,(string *)local_a40,(string *)local_a60)
        ;
        if (!bVar1) {
          CompilerGLSL::
          statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a40,
                     (char (*) [4])0x5cb349,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a60,
                     (char (*) [2])0x5b3b6f);
        }
        ::std::__cxx11::string::~string((string *)local_a60);
        ::std::__cxx11::string::~string((string *)local_a40);
      }
      else {
        bVar1 = Compiler::is_matrix((Compiler *)this,(SPIRType *)pSStack_20);
        if (!bVar1) {
          CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                    ((CompilerGLSL *)local_ae0,id,SUB41(type._4_4_,0));
          CompilerGLSL::to_pointer_expression_abi_cxx11_
                    ((CompilerGLSL *)local_b00,id,SUB41((uint32_t)type,0));
          pSVar5 = Compiler::expression_type((Compiler *)this,(uint32_t)type);
          bVar1 = CompilerGLSL::optimize_read_modify_write
                            (&this->super_CompilerGLSL,pSVar5,(string *)local_ae0,
                             (string *)local_b00);
          if (!bVar1) {
            CompilerGLSL::
            statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                      (&this->super_CompilerGLSL,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_ae0,(char (*) [4])0x5cb349,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_b00,(char (*) [2])0x5b3b6f);
          }
          ::std::__cxx11::string::~string((string *)local_b00);
          ::std::__cxx11::string::~string((string *)local_ae0);
        }
      }
    }
    else {
      rhs_e->need_transpose = false;
      SPIRType::SPIRType((SPIRType *)local_988,(SPIRType *)pSStack_20);
      write_type_1.super_IVariant._12_4_ = 1;
      write_type_1.width = 1;
      for (local_98c = 0; local_98c < *(uint *)&pSStack_20->field_0x14; local_98c = local_98c + 1) {
        CompilerGLSL::to_enclosed_expression_abi_cxx11_
                  ((CompilerGLSL *)&column_index_1,id,SUB41(type._4_4_,0));
        local_9b8 = (string *)::std::__cxx11::string::find_last_of((char)&column_index_1,0x5b);
        if (local_9b8 != (string *)0xffffffffffffffff) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_9d8,this,local_988,0);
          psVar3 = local_9b8;
          local_a20[0x27] = '[';
          local_a20[0x26] = ']';
          join<char,unsigned_int&,char,char_const(&)[2]>
                    ((spirv_cross *)(local_a20 + 0x28),local_a20 + 0x27,&local_98c,local_a20 + 0x26,
                     (char (*) [2])0x5b48c4);
          pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ::std::__cxx11::string::insert((ulong)&column_index_1,psVar3);
          CompilerGLSL::to_extract_component_expression_abi_cxx11_
                    ((CompilerGLSL *)local_a20,id,(uint32_t)type);
          CompilerGLSL::
          statement<char_const(&)[3],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,(char (*) [3])0x5beabb,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                     (char (*) [2])0x5b521c,local_9d8,(char (*) [4])"*)&",pbVar4,
                     (char (*) [4])0x5cb349,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a20,
                     (char (*) [2])0x5b3b6f);
          ::std::__cxx11::string::~string((string *)local_a20);
          ::std::__cxx11::string::~string((string *)(local_a20 + 0x28));
          ::std::__cxx11::string::~string((string *)local_9d8);
        }
        ::std::__cxx11::string::~string((string *)&column_index_1);
      }
      rhs_e->need_transpose = true;
      SPIRType::~SPIRType((SPIRType *)local_988);
    }
    Compiler::register_write((Compiler *)this,type._4_4_);
    ::std::__cxx11::string::~string(local_178);
  }
  else {
    CompilerGLSL::emit_store_statement(&this->super_CompilerGLSL,type._4_4_,(uint32_t)type);
  }
  return;
}

Assistant:

void CompilerMSL::emit_store_statement(uint32_t lhs_expression, uint32_t rhs_expression)
{
	auto &type = expression_type(rhs_expression);

	bool lhs_remapped_type = has_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypeID);
	bool lhs_packed_type = has_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypePacked);
	auto *lhs_e = maybe_get<SPIRExpression>(lhs_expression);
	auto *rhs_e = maybe_get<SPIRExpression>(rhs_expression);

	bool transpose = lhs_e && lhs_e->need_transpose;

	// No physical type remapping, and no packed type, so can just emit a store directly.
	if (!lhs_remapped_type && !lhs_packed_type)
	{
		// We might not be dealing with remapped physical types or packed types,
		// but we might be doing a clean store to a row-major matrix.
		// In this case, we just flip transpose states, and emit the store, a transpose must be in the RHS expression, if any.
		if (is_matrix(type) && lhs_e && lhs_e->need_transpose)
		{
			lhs_e->need_transpose = false;

			if (rhs_e && rhs_e->need_transpose)
			{
				// Direct copy, but might need to unpack RHS.
				// Skip the transpose, as we will transpose when writing to LHS and transpose(transpose(T)) == T.
				rhs_e->need_transpose = false;
				statement(to_expression(lhs_expression), " = ", to_unpacked_row_major_matrix_expression(rhs_expression),
				          ";");
				rhs_e->need_transpose = true;
			}
			else
				statement(to_expression(lhs_expression), " = transpose(", to_unpacked_expression(rhs_expression), ");");

			lhs_e->need_transpose = true;
			register_write(lhs_expression);
		}
		else if (lhs_e && lhs_e->need_transpose)
		{
			lhs_e->need_transpose = false;

			// Storing a column to a row-major matrix. Unroll the write.
			for (uint32_t c = 0; c < type.vecsize; c++)
			{
				auto lhs_expr = to_dereferenced_expression(lhs_expression);
				auto column_index = lhs_expr.find_last_of('[');
				if (column_index != string::npos)
				{
					statement(lhs_expr.insert(column_index, join('[', c, ']')), " = ",
					          to_extract_component_expression(rhs_expression, c), ";");
				}
			}
			lhs_e->need_transpose = true;
			register_write(lhs_expression);
		}
		else
			CompilerGLSL::emit_store_statement(lhs_expression, rhs_expression);
	}
	else if (!lhs_remapped_type && !is_matrix(type) && !transpose)
	{
		// Even if the target type is packed, we can directly store to it. We cannot store to packed matrices directly,
		// since they are declared as array of vectors instead, and we need the fallback path below.
		CompilerGLSL::emit_store_statement(lhs_expression, rhs_expression);
	}
	else
	{
		// Special handling when storing to a remapped physical type.
		// This is mostly to deal with std140 padded matrices or vectors.

		TypeID physical_type_id = lhs_remapped_type ?
		                              ID(get_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypeID)) :
		                              type.self;

		auto &physical_type = get<SPIRType>(physical_type_id);

		string cast_addr_space = "thread";
		auto *p_var_lhs = maybe_get_backing_variable(lhs_expression);
		if (p_var_lhs)
			cast_addr_space = get_type_address_space(get<SPIRType>(p_var_lhs->basetype), lhs_expression);

		if (is_matrix(type))
		{
			const char *packed_pfx = lhs_packed_type ? "packed_" : "";

			// Packed matrices are stored as arrays of packed vectors, so we need
			// to assign the vectors one at a time.
			// For row-major matrices, we need to transpose the *right-hand* side,
			// not the left-hand side.

			// Lots of cases to cover here ...

			bool rhs_transpose = rhs_e && rhs_e->need_transpose;
			SPIRType write_type = type;
			string cast_expr;

			// We're dealing with transpose manually.
			if (rhs_transpose)
				rhs_e->need_transpose = false;

			if (transpose)
			{
				// We're dealing with transpose manually.
				lhs_e->need_transpose = false;
				write_type.vecsize = type.columns;
				write_type.columns = 1;

				if (physical_type.columns != type.columns)
					cast_expr = join("(", cast_addr_space, " ", packed_pfx, type_to_glsl(write_type), "&)");

				if (rhs_transpose)
				{
					// If RHS is also transposed, we can just copy row by row.
					for (uint32_t i = 0; i < type.vecsize; i++)
					{
						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ",
						          to_unpacked_row_major_matrix_expression(rhs_expression), "[", i, "];");
					}
				}
				else
				{
					auto vector_type = expression_type(rhs_expression);
					vector_type.vecsize = vector_type.columns;
					vector_type.columns = 1;

					// Transpose on the fly. Emitting a lot of full transpose() ops and extracting lanes seems very bad,
					// so pick out individual components instead.
					for (uint32_t i = 0; i < type.vecsize; i++)
					{
						string rhs_row = type_to_glsl_constructor(vector_type) + "(";
						for (uint32_t j = 0; j < vector_type.vecsize; j++)
						{
							rhs_row += join(to_enclosed_unpacked_expression(rhs_expression), "[", j, "][", i, "]");
							if (j + 1 < vector_type.vecsize)
								rhs_row += ", ";
						}
						rhs_row += ")";

						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ", rhs_row, ";");
					}
				}

				// We're dealing with transpose manually.
				lhs_e->need_transpose = true;
			}
			else
			{
				write_type.columns = 1;

				if (physical_type.vecsize != type.vecsize)
					cast_expr = join("(", cast_addr_space, " ", packed_pfx, type_to_glsl(write_type), "&)");

				if (rhs_transpose)
				{
					auto vector_type = expression_type(rhs_expression);
					vector_type.columns = 1;

					// Transpose on the fly. Emitting a lot of full transpose() ops and extracting lanes seems very bad,
					// so pick out individual components instead.
					for (uint32_t i = 0; i < type.columns; i++)
					{
						string rhs_row = type_to_glsl_constructor(vector_type) + "(";
						for (uint32_t j = 0; j < vector_type.vecsize; j++)
						{
							// Need to explicitly unpack expression since we've mucked with transpose state.
							auto unpacked_expr = to_unpacked_row_major_matrix_expression(rhs_expression);
							rhs_row += join(unpacked_expr, "[", j, "][", i, "]");
							if (j + 1 < vector_type.vecsize)
								rhs_row += ", ";
						}
						rhs_row += ")";

						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ", rhs_row, ";");
					}
				}
				else
				{
					// Copy column-by-column.
					for (uint32_t i = 0; i < type.columns; i++)
					{
						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ",
						          to_enclosed_unpacked_expression(rhs_expression), "[", i, "];");
					}
				}
			}

			// We're dealing with transpose manually.
			if (rhs_transpose)
				rhs_e->need_transpose = true;
		}
		else if (transpose)
		{
			lhs_e->need_transpose = false;

			SPIRType write_type = type;
			write_type.vecsize = 1;
			write_type.columns = 1;

			// Storing a column to a row-major matrix. Unroll the write.
			for (uint32_t c = 0; c < type.vecsize; c++)
			{
				auto lhs_expr = to_enclosed_expression(lhs_expression);
				auto column_index = lhs_expr.find_last_of('[');
				if (column_index != string::npos)
				{
					statement("((", cast_addr_space, " ", type_to_glsl(write_type), "*)&",
					          lhs_expr.insert(column_index, join('[', c, ']', ")")), " = ",
					          to_extract_component_expression(rhs_expression, c), ";");
				}
			}

			lhs_e->need_transpose = true;
		}
		else if ((is_matrix(physical_type) || is_array(physical_type)) && physical_type.vecsize > type.vecsize)
		{
			assert(type.vecsize >= 1 && type.vecsize <= 3);

			// If we have packed types, we cannot use swizzled stores.
			// We could technically unroll the store for each element if needed.
			// When remapping to a std140 physical type, we always get float4,
			// and the packed decoration should always be removed.
			assert(!lhs_packed_type);

			string lhs = to_dereferenced_expression(lhs_expression);
			string rhs = to_pointer_expression(rhs_expression);

			// Unpack the expression so we can store to it with a float or float2.
			// It's still an l-value, so it's fine. Most other unpacking of expressions turn them into r-values instead.
			lhs = join("(", cast_addr_space, " ", type_to_glsl(type), "&)", enclose_expression(lhs));
			if (!optimize_read_modify_write(expression_type(rhs_expression), lhs, rhs))
				statement(lhs, " = ", rhs, ";");
		}
		else if (!is_matrix(type))
		{
			string lhs = to_dereferenced_expression(lhs_expression);
			string rhs = to_pointer_expression(rhs_expression);
			if (!optimize_read_modify_write(expression_type(rhs_expression), lhs, rhs))
				statement(lhs, " = ", rhs, ";");
		}

		register_write(lhs_expression);
	}
}